

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Graph<std::pair<double,_double>_>::twoOptSwap
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          Graph<std::pair<double,_double>_> *this,vector<int,_std::allocator<int>_> *ord,int *i,
          int *k)

{
  ulong uVar1;
  const_reference pvVar2;
  int c;
  size_type sVar3;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (sVar3 = 0; uVar1 = (ulong)*i, (long)sVar3 < (long)uVar1; sVar3 = sVar3 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(ord,sVar3);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,pvVar2);
  }
  sVar3 = (size_type)*k;
  while ((long)(int)uVar1 <= (long)sVar3) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(ord,sVar3);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,pvVar2);
    sVar3 = sVar3 - 1;
    uVar1 = (ulong)(uint)*i;
  }
  uVar1 = (ulong)*k;
  while (uVar1 = uVar1 + 1,
        uVar1 < (ulong)((long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start >> 2)) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at(ord,uVar1);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,pvVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Graph<T>::twoOptSwap(const vector<int> &ord, const int &i, const int &k) {
    vector<int> new_ord;

    for (int c = 0; c < i; c++) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k; c >= i; c--) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k + 1; c < ord.size(); c++) {
        new_ord.push_back(ord.at(c));
    }

    return new_ord;
}